

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v6::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  char *in_RAX;
  ulong uVar6;
  char *unaff_RBX;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  
  if (other->exp_ < this->exp_) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  iVar4 = compare(this,other);
  if (iVar4 < 0) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  uVar5 = other->exp_ - this->exp_;
  sVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 == 0) {
    uVar6 = 0;
  }
  else {
    if ((int)uVar5 < 0) goto LAB_0018d6c8;
    puVar2 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar7 = 0;
    lVar9 = 0;
    do {
      uVar6 = (ulong)puVar3[uVar5 + sVar7] + (lVar9 - (ulong)puVar2[sVar7]);
      puVar3[uVar5 + sVar7] = (uint)uVar6;
      lVar9 = (long)uVar6 >> 0x3f;
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
    uVar6 = uVar6 >> 0x3f;
    uVar5 = uVar5 + (int)sVar7;
  }
  if ((int)uVar6 != 0) {
    if ((int)uVar5 < 0) {
LAB_0018d6c8:
      assert_fail(unaff_RBX,0,in_RAX);
    }
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar8 = (ulong)puVar2[uVar5];
    do {
      uVar8 = (uVar8 & 0xffffffff) - uVar6;
      uVar6 = uVar8 >> 0x3f;
    } while ((long)uVar8 < 0);
    puVar2[uVar5] = (uint)uVar8;
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j) {
      subtract_bigits(i, other.bigits_[j], borrow);
    }
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }